

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_synciv(NegativeTestContext *ctx)

{
  GLsync p_Var1;
  allocator<char> local_bd;
  GLsizei length;
  string local_b8;
  GLint values [32];
  
  length = -1;
  values[0x1c] = -0x32323233;
  values[0x1d] = -0x32323233;
  values[0x1e] = -0x32323233;
  values[0x1f] = -0x32323233;
  values[0x18] = -0x32323233;
  values[0x19] = -0x32323233;
  values[0x1a] = -0x32323233;
  values[0x1b] = -0x32323233;
  values[0x14] = -0x32323233;
  values[0x15] = -0x32323233;
  values[0x16] = -0x32323233;
  values[0x17] = -0x32323233;
  values[0x10] = -0x32323233;
  values[0x11] = -0x32323233;
  values[0x12] = -0x32323233;
  values[0x13] = -0x32323233;
  values[0xc] = -0x32323233;
  values[0xd] = -0x32323233;
  values[0xe] = -0x32323233;
  values[0xf] = -0x32323233;
  values[8] = -0x32323233;
  values[9] = -0x32323233;
  values[10] = -0x32323233;
  values[0xb] = -0x32323233;
  values[4] = -0x32323233;
  values[5] = -0x32323233;
  values[6] = -0x32323233;
  values[7] = -0x32323233;
  values[0] = -0x32323233;
  values[1] = -0x32323233;
  values[2] = -0x32323233;
  values[3] = -0x32323233;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "GL_INVALID_VALUE is generated if sync is not the name of a sync object.",&local_bd);
  NegativeTestContext::beginSection(ctx,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  glu::CallLogWrapper::glGetSynciv
            (&ctx->super_CallLogWrapper,(GLsync)0x0,0x9112,0x20,&length,values);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "GL_INVALID_ENUM is generated if pname is not one of the accepted tokens.",&local_bd);
  NegativeTestContext::beginSection(ctx,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  p_Var1 = glu::CallLogWrapper::glFenceSync(&ctx->super_CallLogWrapper,0x9117,0);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetSynciv(&ctx->super_CallLogWrapper,p_Var1,0xffffffff,0x20,&length,values)
  ;
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteSync(&ctx->super_CallLogWrapper,p_Var1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"GL_INVALID_VALUE is generated if bufSize is negative.",&local_bd);
  NegativeTestContext::beginSection(ctx,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  p_Var1 = glu::CallLogWrapper::glFenceSync(&ctx->super_CallLogWrapper,0x9117,0);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetSynciv(&ctx->super_CallLogWrapper,p_Var1,0x9112,-1,&length,values);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteSync(&ctx->super_CallLogWrapper,p_Var1);
  return;
}

Assistant:

void get_synciv (NegativeTestContext& ctx)
{
	GLsizei	length		= -1;
	GLint	values[32];
	GLsync	sync;

	deMemset(&values[0], 0xcd, sizeof(values));

	ctx.beginSection("GL_INVALID_VALUE is generated if sync is not the name of a sync object.");
	ctx.glGetSynciv(0, GL_OBJECT_TYPE, 32, &length, &values[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not one of the accepted tokens.");
	sync = ctx.glFenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	ctx.expectError(GL_NO_ERROR);
	ctx.glGetSynciv(sync, -1, 32, &length, &values[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.glDeleteSync(sync);

	ctx.beginSection("GL_INVALID_VALUE is generated if bufSize is negative.");
	sync = ctx.glFenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	ctx.expectError(GL_NO_ERROR);
	ctx.glGetSynciv(sync, GL_OBJECT_TYPE, -1, &length, &values[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glDeleteSync(sync);
}